

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void avgFinalize(sqlite3_context *context)

{
  double *pdVar1;
  SumCtx *p;
  sqlite3_context *context_local;
  
  pdVar1 = (double *)sqlite3_aggregate_context(context,0);
  if ((pdVar1 != (double *)0x0) && (0 < (long)pdVar1[2])) {
    sqlite3_result_double(context,*pdVar1 / (double)(long)pdVar1[2]);
  }
  return;
}

Assistant:

static void avgFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  if( p && p->cnt>0 ){
    sqlite3_result_double(context, p->rSum/(double)p->cnt);
  }
}